

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLLoader.cpp
# Opt level: O0

void sfogl_LoadFunctions(void)

{
  bool bVar1;
  int local_c;
  int i;
  
  ClearExtensionVars();
  for (local_c = 0; local_c < g_extensionMapSize; local_c = local_c + 1) {
    bVar1 = sf::Context::isExtensionAvailable(ExtensionMap[local_c].extensionName);
    if (bVar1) {
      LoadExtension(ExtensionMap + local_c);
    }
  }
  return;
}

Assistant:

void sfogl_LoadFunctions()
{
    ClearExtensionVars();

    for (int i = 0; i < g_extensionMapSize; ++i)
    {
        if (sf::Context::isExtensionAvailable(ExtensionMap[i].extensionName))
            LoadExtension(ExtensionMap[i]);
    }
}